

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall bloaty::MmapInputFile::~MmapInputFile(MmapInputFile *this)

{
  FILE *__stream;
  int iVar1;
  const_pointer pvVar2;
  size_type __len;
  int *piVar3;
  char *pcVar4;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR_TryOpen_00911510;
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 5));
  if (pvVar2 != (const_pointer)0x0) {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 5));
    __len = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 5));
    iVar1 = munmap(pvVar2,__len);
    __stream = _stderr;
    if (iVar1 != 0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fprintf(__stream,"bloaty: error calling munmap(): %s\n",pcVar4);
    }
  }
  InputFile::~InputFile((InputFile *)0x19129e);
  return;
}

Assistant:

MmapInputFile::~MmapInputFile() {
  if (data_.data() != nullptr &&
      munmap(const_cast<char*>(data_.data()), data_.size()) != 0) {
    fprintf(stderr, "bloaty: error calling munmap(): %s\n", strerror(errno));
  }
}